

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestExpectation.cpp
# Opt level: O1

void __thiscall psy::C::Decl::Decl(Decl *this)

{
  (this->ident_)._M_dataplus._M_p = (pointer)&(this->ident_).field_2;
  (this->ident_)._M_string_length = 0;
  (this->ident_).field_2._M_local_buf[0] = '\0';
  Ty::Ty(&this->ty_,this);
  return;
}

Assistant:

Decl::Decl()
    : ty_(*this)
{}